

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::mergeUniformObjects
          (TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit)

{
  int iVar1;
  int iVar2;
  EShLanguage unitStage;
  TIntermAggregate *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type __new_size;
  iterator iStack_70;
  bool mergeExistingOnly;
  TIntermNode **local_60;
  TIntermNode **local_58;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_50;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  end;
  TIntermSequence unitLinkerObjects;
  TIntermSequence *linkerObjects;
  TIntermediate *unit_local;
  TInfoSink *infoSink_local;
  TIntermediate *this_local;
  
  if ((unit->treeRoot != (TIntermNode *)0x0) && (this->treeRoot != (TIntermNode *)0x0)) {
    pTVar3 = findLinkerObjects(this);
    iVar1 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])();
    pTVar3 = findLinkerObjects(unit);
    iVar2 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])();
    TVector<TIntermNode_*>::TVector
              ((TVector<TIntermNode_*> *)&end,
               (TVector<TIntermNode_*> *)CONCAT44(extraout_var_00,iVar2));
    local_58 = (TIntermNode **)
               std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                         ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)&end);
    local_60 = (TIntermNode **)
               std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                         ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)&end);
    local_50 = std::
               remove_if<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,glslang::TIntermediate::mergeUniformObjects(TInfoSink&,glslang::TIntermediate&)::__0>
                         (local_58,local_60);
    iStack_70 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)&end);
    __new_size = __gnu_cxx::operator-(&local_50,&stack0xffffffffffffff90);
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::resize
              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)&end,__new_size);
    mergeGlobalUniformBlocks(this,infoSink,unit,false);
    unitStage = getStage(unit);
    mergeLinkerObjects(this,infoSink,(TIntermSequence *)CONCAT44(extraout_var,iVar1),
                       (TIntermSequence *)&end,unitStage);
    TVector<TIntermNode_*>::~TVector((TVector<TIntermNode_*> *)&end);
  }
  return;
}

Assistant:

void TIntermediate::mergeUniformObjects(TInfoSink& infoSink, TIntermediate& unit) {
    if (unit.treeRoot == nullptr || treeRoot == nullptr)
        return;

    // Get the linker-object lists
    TIntermSequence& linkerObjects = findLinkerObjects()->getSequence();
    TIntermSequence unitLinkerObjects = unit.findLinkerObjects()->getSequence();

    // filter unitLinkerObjects to only contain uniforms
    auto end = std::remove_if(unitLinkerObjects.begin(), unitLinkerObjects.end(),
        [](TIntermNode* node) {return node->getAsSymbolNode()->getQualifier().storage != EvqUniform &&
                                      node->getAsSymbolNode()->getQualifier().storage != EvqBuffer; });
    unitLinkerObjects.resize(end - unitLinkerObjects.begin());

    // merge uniforms and do error checking
    bool mergeExistingOnly = false;
    mergeGlobalUniformBlocks(infoSink, unit, mergeExistingOnly);
    mergeLinkerObjects(infoSink, linkerObjects, unitLinkerObjects, unit.getStage());
}